

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O0

void __thiscall
GdlSetAttrItem::FixGlyphAttrsInRules
          (GdlSetAttrItem *this,GrcManager *pcman,
          vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *vpglfcInClasses,
          GdlRule *prule,int irit)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_type_conflict sVar4;
  reference ppGVar5;
  long *in_RDI;
  Symbol psym_1;
  bool fDeleteThis;
  uint srAttachTo;
  GdlSlotRefExpression *pexpSR;
  string staT_1;
  int srAttachToValue;
  int nTmp;
  string staT;
  Symbol psym;
  GdlAttrValueSpec *pavs;
  int ipavs;
  Symbol psymOutput;
  bool fDidAttachWith;
  bool fDidAttachAt;
  bool fAttachWithY;
  bool fAttachWithX;
  bool fAttachAtY;
  bool fAttachAtX;
  bool fAttachTo;
  bool fGpointWith;
  bool fXYWith;
  bool fGpointAt;
  bool fXYAt;
  GrcSymbolTableEntry *in_stack_fffffffffffffba8;
  GrcSymbolTableEntry *in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb8;
  undefined2 in_stack_fffffffffffffbbc;
  byte in_stack_fffffffffffffbbe;
  undefined1 in_stack_fffffffffffffbbf;
  Symbol in_stack_fffffffffffffbc0;
  const_iterator in_stack_fffffffffffffbc8;
  undefined5 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd5;
  undefined1 in_stack_fffffffffffffbd6;
  undefined1 in_stack_fffffffffffffbd7;
  GrcManager *in_stack_fffffffffffffbd8;
  GdlSetAttrItem *in_stack_fffffffffffffbe0;
  allocator *paVar6;
  bool local_412;
  string *in_stack_fffffffffffffbf8;
  undefined5 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc05;
  undefined1 in_stack_fffffffffffffc06;
  undefined1 in_stack_fffffffffffffc07;
  undefined8 in_stack_fffffffffffffc08;
  int nID;
  GrcErrorList *in_stack_fffffffffffffc10;
  bool local_3e3;
  bool local_3ca;
  bool local_3b1;
  GdlSlotRefExpression *local_390;
  bool local_356;
  bool local_352;
  bool local_2f9;
  bool local_2f5;
  undefined1 local_2c1 [38];
  byte local_29b;
  byte local_29a;
  allocator local_299;
  string local_298 [37];
  byte local_273;
  byte local_272;
  allocator local_271;
  string local_270 [37];
  byte local_24b;
  byte local_24a;
  allocator local_249;
  string local_248 [37];
  byte local_223;
  byte local_222;
  allocator local_221;
  string local_220 [37];
  byte local_1fb;
  byte local_1fa;
  allocator local_1f9;
  string local_1f8 [32];
  Symbol local_1d8;
  byte local_1ca;
  allocator local_1c9;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [36];
  int local_17c;
  GdlSlotRefExpression *local_178;
  allocator local_169;
  string local_168 [32];
  string local_148 [39];
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [32];
  int local_d8;
  allocator local_d1;
  string local_d0 [36];
  undefined1 local_ac [4];
  undefined4 local_a8;
  allocator local_a1;
  string local_a0 [48];
  string local_70 [32];
  Symbol local_50;
  value_type local_48;
  int local_3c;
  long local_38;
  undefined1 local_2f;
  undefined1 local_2e;
  bool local_2d;
  bool local_2c;
  bool local_2b;
  bool local_2a;
  byte local_29;
  byte local_28;
  byte local_27;
  byte local_26;
  byte local_25;
  
  GdlRuleItem::FixGlyphAttrsInRules
            ((GdlRuleItem *)
             CONCAT17(in_stack_fffffffffffffbd7,
                      CONCAT16(in_stack_fffffffffffffbd6,
                               CONCAT15(in_stack_fffffffffffffbd5,in_stack_fffffffffffffbd0))),
             (GrcManager *)in_stack_fffffffffffffbc8._M_current,
             (vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *)
             in_stack_fffffffffffffbc0,
             (GdlRule *)
             CONCAT17(in_stack_fffffffffffffbbf,
                      CONCAT16(in_stack_fffffffffffffbbe,
                               CONCAT24(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8))),
             (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
  local_25 = 0;
  local_26 = 0;
  local_27 = 0;
  local_28 = 0;
  local_29 = 0;
  local_2a = false;
  local_2b = false;
  local_2c = false;
  local_2d = false;
  local_2e = ktcNone >> 0x18;
  local_2f = ktcNone >> 0x10;
  local_38 = (**(code **)(*in_RDI + 0x130))();
  local_3c = 0;
  while( true ) {
    iVar3 = local_3c;
    sVar4 = std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::size
                      ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)
                       (in_RDI + 0xf));
    nID = (int)((ulong)in_stack_fffffffffffffc08 >> 0x20);
    if ((int)sVar4 <= iVar3) break;
    ppGVar5 = std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::operator[]
                        ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)
                         (in_RDI + 0xf),(long)local_3c);
    local_48 = *ppGVar5;
    local_50 = local_48->m_psymName;
    bVar1 = GrcSymbolTableEntry::IsAttachAtField(in_stack_fffffffffffffbc0);
    if (bVar1) {
      GrcSymbolTableEntry::LastField_abi_cxx11_(in_stack_fffffffffffffba8);
      local_2f5 = true;
      if ((local_2a & 1U) == 0) {
        bVar1 = std::operator==(&in_stack_fffffffffffffbb0->m_staFieldName,
                                (char *)in_stack_fffffffffffffba8);
        local_2f5 = true;
        if (!bVar1) {
          bVar1 = std::operator==(&in_stack_fffffffffffffbb0->m_staFieldName,
                                  (char *)in_stack_fffffffffffffba8);
          local_2f5 = true;
          if (!bVar1) {
            local_2f5 = std::operator==(&in_stack_fffffffffffffbb0->m_staFieldName,
                                        (char *)in_stack_fffffffffffffba8);
          }
        }
      }
      local_2a = local_2f5;
      local_2f9 = true;
      if ((local_2b & 1U) == 0) {
        bVar1 = std::operator==(&in_stack_fffffffffffffbb0->m_staFieldName,
                                (char *)in_stack_fffffffffffffba8);
        local_2f9 = true;
        if (!bVar1) {
          bVar1 = std::operator==(&in_stack_fffffffffffffbb0->m_staFieldName,
                                  (char *)in_stack_fffffffffffffba8);
          local_2f9 = true;
          if (!bVar1) {
            local_2f9 = std::operator==(&in_stack_fffffffffffffbb0->m_staFieldName,
                                        (char *)in_stack_fffffffffffffba8);
          }
        }
      }
      local_2b = local_2f9;
      bVar1 = std::operator==(&in_stack_fffffffffffffbb0->m_staFieldName,
                              (char *)in_stack_fffffffffffffba8);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a0,"Cannot use gpath function within a rule",&local_a1);
        GrcErrorList::AddError
                  (in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                   (GdlObject *)
                   CONCAT17(in_stack_fffffffffffffc07,
                            CONCAT16(in_stack_fffffffffffffc06,
                                     CONCAT15(in_stack_fffffffffffffc05,in_stack_fffffffffffffc00)))
                   ,in_stack_fffffffffffffbf8);
        std::__cxx11::string::~string(local_a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        local_a8 = 4;
      }
      else {
        bVar1 = std::operator==(&in_stack_fffffffffffffbb0->m_staFieldName,
                                (char *)in_stack_fffffffffffffba8);
        if ((bVar1) &&
           (uVar2 = (*local_48->m_pexpValue->_vptr_GdlExpression[7])
                              (local_48->m_pexpValue,local_ac,0), (uVar2 & 1) != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_d0,"Cannot use gpoint function within a rule",&local_d1);
          GrcErrorList::AddError
                    (in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                     (GdlObject *)
                     CONCAT17(in_stack_fffffffffffffc07,
                              CONCAT16(in_stack_fffffffffffffc06,
                                       CONCAT15(in_stack_fffffffffffffc05,in_stack_fffffffffffffc00)
                                      )),in_stack_fffffffffffffbf8);
          std::__cxx11::string::~string(local_d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_d1);
          local_a8 = 4;
        }
        else if (((local_2e & 1) == ktcNone >> 0x18) ||
                (bVar1 = GdlAttrValueSpec::Flattened(local_48), !bVar1)) {
          local_d8 = AttachToSettingValue((GdlSetAttrItem *)in_stack_fffffffffffffbd8);
          if (local_d8 == -1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_f8,"Attachment checks could not be done for value of attach.at",
                       &local_f9);
            GrcErrorList::AddWarning
                      (in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                       (GdlObject *)
                       CONCAT17(in_stack_fffffffffffffc07,
                                CONCAT16(in_stack_fffffffffffffc06,
                                         CONCAT15(in_stack_fffffffffffffc05,
                                                  in_stack_fffffffffffffc00))),
                       in_stack_fffffffffffffbf8);
            std::__cxx11::string::~string(local_f8);
            std::allocator<char>::~allocator((allocator<char> *)&local_f9);
          }
          else if (local_d8 == -2) {
            local_29 = 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_120,"Inappropriate value of attach.to",&local_121);
            GrcErrorList::AddError
                      (in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                       (GdlObject *)
                       CONCAT17(in_stack_fffffffffffffc07,
                                CONCAT16(in_stack_fffffffffffffc06,
                                         CONCAT15(in_stack_fffffffffffffc05,
                                                  in_stack_fffffffffffffc00))),
                       in_stack_fffffffffffffbf8);
            std::__cxx11::string::~string(local_120);
            std::allocator<char>::~allocator((allocator<char> *)&local_121);
          }
          else {
            local_29 = 1;
            bVar1 = GdlAttrValueSpec::Flattened(local_48);
            if (bVar1) {
              GdlAttrValueSpec::CheckAttachAtPoint
                        ((GdlAttrValueSpec *)
                         CONCAT17(in_stack_fffffffffffffbd7,
                                  CONCAT16(in_stack_fffffffffffffbd6,
                                           CONCAT15(in_stack_fffffffffffffbd5,
                                                    in_stack_fffffffffffffbd0))),
                         (GrcManager *)in_stack_fffffffffffffbc8._M_current,
                         (vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *)
                         in_stack_fffffffffffffbc0,
                         CONCAT13(in_stack_fffffffffffffbbf,
                                  CONCAT12(in_stack_fffffffffffffbbe,in_stack_fffffffffffffbbc)),
                         (bool *)in_stack_fffffffffffffbb0,(bool *)in_stack_fffffffffffffba8);
              local_2e = 1;
            }
            else {
              GdlAttrValueSpec::FixGlyphAttrsInRules
                        ((GdlAttrValueSpec *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
                         (vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *)
                         CONCAT17(in_stack_fffffffffffffbd7,
                                  CONCAT16(in_stack_fffffffffffffbd6,
                                           CONCAT15(in_stack_fffffffffffffbd5,
                                                    in_stack_fffffffffffffbd0))),
                         (int)((ulong)in_stack_fffffffffffffbc8._M_current >> 0x20),
                         in_stack_fffffffffffffbc0);
            }
          }
          local_a8 = 0;
        }
        else {
          local_a8 = 4;
        }
      }
      std::__cxx11::string::~string(local_70);
    }
    else {
      bVar1 = GrcSymbolTableEntry::IsAttachWithField(in_stack_fffffffffffffbc0);
      if (bVar1) {
        GrcSymbolTableEntry::LastField_abi_cxx11_(in_stack_fffffffffffffba8);
        local_352 = true;
        if ((local_2c & 1U) == 0) {
          bVar1 = std::operator==(&in_stack_fffffffffffffbb0->m_staFieldName,
                                  (char *)in_stack_fffffffffffffba8);
          local_352 = true;
          if (!bVar1) {
            bVar1 = std::operator==(&in_stack_fffffffffffffbb0->m_staFieldName,
                                    (char *)in_stack_fffffffffffffba8);
            local_352 = true;
            if (!bVar1) {
              local_352 = std::operator==(&in_stack_fffffffffffffbb0->m_staFieldName,
                                          (char *)in_stack_fffffffffffffba8);
            }
          }
        }
        local_2c = local_352;
        local_356 = true;
        if ((local_2d & 1U) == 0) {
          bVar1 = std::operator==(&in_stack_fffffffffffffbb0->m_staFieldName,
                                  (char *)in_stack_fffffffffffffba8);
          local_356 = true;
          if (!bVar1) {
            bVar1 = std::operator==(&in_stack_fffffffffffffbb0->m_staFieldName,
                                    (char *)in_stack_fffffffffffffba8);
            local_356 = true;
            if (!bVar1) {
              local_356 = std::operator==(&in_stack_fffffffffffffbb0->m_staFieldName,
                                          (char *)in_stack_fffffffffffffba8);
            }
          }
        }
        local_2d = local_356;
        bVar1 = std::operator==(&in_stack_fffffffffffffbb0->m_staFieldName,
                                (char *)in_stack_fffffffffffffba8);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_168,"Cannot use gpath function within a rule",&local_169);
          GrcErrorList::AddError
                    (in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                     (GdlObject *)
                     CONCAT17(in_stack_fffffffffffffc07,
                              CONCAT16(in_stack_fffffffffffffc06,
                                       CONCAT15(in_stack_fffffffffffffc05,in_stack_fffffffffffffc00)
                                      )),in_stack_fffffffffffffbf8);
          std::__cxx11::string::~string(local_168);
          std::allocator<char>::~allocator((allocator<char> *)&local_169);
          local_a8 = 4;
        }
        else if (((local_2f & 1) == ktcNone >> 0x10) ||
                (bVar1 = GdlAttrValueSpec::Flattened(local_48), !bVar1)) {
          if ((local_29 & 1) == 0) {
            iVar3 = AttachToSettingValue((GdlSetAttrItem *)in_stack_fffffffffffffbd8);
            local_29 = iVar3 != -1;
          }
          bVar1 = GdlAttrValueSpec::Flattened(local_48);
          if (bVar1) {
            GdlAttrValueSpec::CheckAttachWithPoint
                      ((GdlAttrValueSpec *)
                       CONCAT17(in_stack_fffffffffffffbd7,
                                CONCAT16(in_stack_fffffffffffffbd6,
                                         CONCAT15(in_stack_fffffffffffffbd5,
                                                  in_stack_fffffffffffffbd0))),
                       (GrcManager *)in_stack_fffffffffffffbc8._M_current,
                       (vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *)
                       in_stack_fffffffffffffbc0,
                       CONCAT13(in_stack_fffffffffffffbbf,
                                CONCAT12(in_stack_fffffffffffffbbe,in_stack_fffffffffffffbbc)),
                       (bool *)in_stack_fffffffffffffbb0,(bool *)in_stack_fffffffffffffba8);
            local_2f = 1;
          }
          else {
            GdlAttrValueSpec::FixGlyphAttrsInRules
                      ((GdlAttrValueSpec *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
                       (vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *)
                       CONCAT17(in_stack_fffffffffffffbd7,
                                CONCAT16(in_stack_fffffffffffffbd6,
                                         CONCAT15(in_stack_fffffffffffffbd5,
                                                  in_stack_fffffffffffffbd0))),
                       (int)((ulong)in_stack_fffffffffffffbc8._M_current >> 0x20),
                       in_stack_fffffffffffffbc0);
          }
          local_a8 = 0;
        }
        else {
          local_a8 = 4;
        }
        std::__cxx11::string::~string(local_148);
      }
      else {
        bVar1 = GrcSymbolTableEntry::IsComponentRef(in_stack_fffffffffffffbc0);
        if (bVar1) {
          CheckCompBox(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
                       (Symbol)CONCAT17(in_stack_fffffffffffffbd7,
                                        CONCAT16(in_stack_fffffffffffffbd6,
                                                 CONCAT15(in_stack_fffffffffffffbd5,
                                                          in_stack_fffffffffffffbd0))));
        }
        else if (local_38 != 0) {
          bVar1 = GrcSymbolTableEntry::IsAttachTo(in_stack_fffffffffffffbc0);
          if (bVar1) {
            if (local_48->m_pexpValue == (GdlExpression *)0x0) {
              local_390 = (GdlSlotRefExpression *)0x0;
            }
            else {
              local_390 = (GdlSlotRefExpression *)
                          __dynamic_cast(local_48->m_pexpValue,&GdlExpression::typeinfo,
                                         &GdlSlotRefExpression::typeinfo,0);
            }
            local_178 = local_390;
            if ((local_390 != (GdlSlotRefExpression *)0x0) &&
               (local_17c = GdlSlotRefExpression::SlotNumber(local_390), local_17c != 0)) {
              GdlRule::NumberOfSlots((GdlRule *)0x147c3f);
            }
          }
          GdlAttrValueSpec::FixGlyphAttrsInRules
                    ((GdlAttrValueSpec *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
                     (vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *)
                     CONCAT17(in_stack_fffffffffffffbd7,
                              CONCAT16(in_stack_fffffffffffffbd6,
                                       CONCAT15(in_stack_fffffffffffffbd5,in_stack_fffffffffffffbd0)
                                      )),(int)((ulong)in_stack_fffffffffffffbc8._M_current >> 0x20),
                     in_stack_fffffffffffffbc0);
        }
      }
    }
    local_3c = local_3c + 1;
  }
  if ((((((local_29 & 1) != 0) || ((local_2a & 1U) != 0)) || ((local_2b & 1U) != 0)) ||
      (((local_2c & 1U) != 0 || ((local_2d & 1U) != 0)))) &&
     (((((local_29 & 1) == 0 || (((local_2a & 1U) == 0 || ((local_2b & 1U) == 0)))) ||
       ((local_2c & 1U) == 0)) || ((local_2d & 1U) == 0)))) {
    if ((((local_2a & 1U) == 0) && ((local_2b & 1U) == 0)) || ((local_29 & 1) != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c8,"Incomplete attachment specification",&local_1c9);
      GrcErrorList::AddWarning
                (in_stack_fffffffffffffc10,nID,
                 (GdlObject *)
                 CONCAT17(in_stack_fffffffffffffc07,
                          CONCAT16(in_stack_fffffffffffffc06,
                                   CONCAT15(in_stack_fffffffffffffc05,in_stack_fffffffffffffc00))),
                 in_stack_fffffffffffffbf8);
      std::__cxx11::string::~string(local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1a0,"Cannot specify attach.at without attach.to",&local_1a1);
      GrcErrorList::AddError
                (in_stack_fffffffffffffc10,nID,
                 (GdlObject *)
                 CONCAT17(in_stack_fffffffffffffc07,
                          CONCAT16(in_stack_fffffffffffffc06,
                                   CONCAT15(in_stack_fffffffffffffc05,in_stack_fffffffffffffc00))),
                 in_stack_fffffffffffffbf8);
      std::__cxx11::string::~string(local_1a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    }
  }
  sVar4 = std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::size
                    ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)
                     (in_RDI + 0xf));
  local_3c = (int)sVar4;
  do {
    local_3c = local_3c + -1;
    if (local_3c < 0) {
      return;
    }
    local_1ca = 0;
    ppGVar5 = std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::operator[]
                        ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)
                         (in_RDI + 0xf),(long)local_3c);
    local_1d8 = (*ppGVar5)->m_psymName;
    bVar1 = GrcSymbolTableEntry::IsAttachAtField(in_stack_fffffffffffffbc0);
    if (bVar1) {
      ppGVar5 = std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::operator[]
                          ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)
                           (in_RDI + 0xf),(long)local_3c);
      bVar1 = GdlAttrValueSpec::Flattened(*ppGVar5);
      if (!bVar1) goto LAB_00148354;
      local_1fa = 0;
      local_1fb = 0;
      local_222 = 0;
      local_223 = 0;
      local_3b1 = false;
      if ((local_25 & 1) == 0) {
        std::allocator<char>::allocator();
        local_1fa = 1;
        std::__cxx11::string::string(local_1f8,"x",&local_1f9);
        local_1fb = 1;
        bVar1 = GrcSymbolTableEntry::LastFieldIs
                          (in_stack_fffffffffffffbb0,&in_stack_fffffffffffffba8->m_staFieldName);
        local_3ca = true;
        if (!bVar1) {
          std::allocator<char>::allocator();
          local_222 = 1;
          std::__cxx11::string::string(local_220,"y",&local_221);
          local_223 = 1;
          local_3ca = GrcSymbolTableEntry::LastFieldIs
                                (in_stack_fffffffffffffbb0,
                                 &in_stack_fffffffffffffba8->m_staFieldName);
        }
        local_3b1 = local_3ca;
      }
      if ((local_223 & 1) != 0) {
        std::__cxx11::string::~string(local_220);
      }
      if ((local_222 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_221);
      }
      if ((local_1fb & 1) != 0) {
        std::__cxx11::string::~string(local_1f8);
      }
      if ((local_1fa & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      }
      if (local_3b1 == false) {
        local_24a = 0;
        local_24b = 0;
        local_3e3 = false;
        if ((local_26 & 1) == 0) {
          paVar6 = &local_249;
          std::allocator<char>::allocator();
          local_24a = 1;
          std::__cxx11::string::string(local_248,"gpoint",paVar6);
          local_24b = 1;
          local_3e3 = GrcSymbolTableEntry::LastFieldIs
                                (in_stack_fffffffffffffbb0,
                                 &in_stack_fffffffffffffba8->m_staFieldName);
        }
        if ((local_24b & 1) != 0) {
          std::__cxx11::string::~string(local_248);
        }
        if ((local_24a & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_249);
        }
        if ((local_3e3 & 1U) != 0) {
          local_1ca = 1;
        }
      }
      else {
        local_1ca = 1;
      }
    }
    else {
LAB_00148354:
      bVar1 = GrcSymbolTableEntry::IsAttachWithField(in_stack_fffffffffffffbc0);
      if (bVar1) {
        ppGVar5 = std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::operator[]
                            ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)
                             (in_RDI + 0xf),(long)local_3c);
        bVar1 = GdlAttrValueSpec::Flattened(*ppGVar5);
        if (bVar1) {
          local_272 = 0;
          local_273 = 0;
          local_29a = 0;
          local_29b = 0;
          local_412 = false;
          if ((local_27 & 1) == 0) {
            paVar6 = &local_271;
            std::allocator<char>::allocator();
            local_272 = 1;
            std::__cxx11::string::string(local_270,"x",paVar6);
            local_273 = 1;
            bVar1 = GrcSymbolTableEntry::LastFieldIs
                              (in_stack_fffffffffffffbb0,&in_stack_fffffffffffffba8->m_staFieldName)
            ;
            local_412 = true;
            if (!bVar1) {
              paVar6 = &local_299;
              std::allocator<char>::allocator();
              local_29a = 1;
              std::__cxx11::string::string(local_298,"y",paVar6);
              local_29b = 1;
              local_412 = GrcSymbolTableEntry::LastFieldIs
                                    (in_stack_fffffffffffffbb0,
                                     &in_stack_fffffffffffffba8->m_staFieldName);
            }
          }
          if ((local_29b & 1) != 0) {
            std::__cxx11::string::~string(local_298);
          }
          if ((local_29a & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_299);
          }
          if ((local_273 & 1) != 0) {
            std::__cxx11::string::~string(local_270);
          }
          if ((local_272 & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_271);
          }
          if ((local_412 & 1U) == 0) {
            in_stack_fffffffffffffbbe = 0;
            if ((local_28 & 1) == 0) {
              in_stack_fffffffffffffbc8._M_current = (GdlAttrValueSpec **)local_2c1;
              in_stack_fffffffffffffbc0 = local_1d8;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)(local_2c1 + 1),"gpoint",
                         (allocator *)in_stack_fffffffffffffbc8._M_current);
              in_stack_fffffffffffffbbe =
                   GrcSymbolTableEntry::LastFieldIs
                             (in_stack_fffffffffffffbb0,&in_stack_fffffffffffffba8->m_staFieldName);
              in_stack_fffffffffffffbbf = in_stack_fffffffffffffbbe;
              std::__cxx11::string::~string((string *)(local_2c1 + 1));
              std::allocator<char>::~allocator((allocator<char> *)local_2c1);
            }
            if ((in_stack_fffffffffffffbbe & 1) != 0) {
              local_1ca = 1;
            }
          }
          else {
            local_1ca = 1;
          }
        }
      }
    }
    if ((local_1ca & 1) != 0) {
      ppGVar5 = std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::operator[]
                          ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)
                           (in_RDI + 0xf),(long)local_3c);
      in_stack_fffffffffffffbb0 = (GrcSymbolTableEntry *)*ppGVar5;
      if (in_stack_fffffffffffffbb0 != (GrcSymbolTableEntry *)0x0) {
        GdlAttrValueSpec::~GdlAttrValueSpec((GdlAttrValueSpec *)in_stack_fffffffffffffbb0);
        operator_delete(in_stack_fffffffffffffbb0,0x48);
      }
      in_stack_fffffffffffffba8 = (GrcSymbolTableEntry *)(in_RDI + 0xf);
      std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::begin
                ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)
                 in_stack_fffffffffffffba8);
      __gnu_cxx::
      __normal_iterator<GdlAttrValueSpec_**,_std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>_>
      ::operator+((__normal_iterator<GdlAttrValueSpec_**,_std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>_>
                   *)CONCAT17(in_stack_fffffffffffffbbf,
                              CONCAT16(in_stack_fffffffffffffbbe,
                                       CONCAT24(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8)
                                      )),(difference_type)in_stack_fffffffffffffbb0);
      __gnu_cxx::
      __normal_iterator<GdlAttrValueSpec*const*,std::vector<GdlAttrValueSpec*,std::allocator<GdlAttrValueSpec*>>>
      ::__normal_iterator<GdlAttrValueSpec**>
                ((__normal_iterator<GdlAttrValueSpec_*const_*,_std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>_>
                  *)in_stack_fffffffffffffbb0,
                 (__normal_iterator<GdlAttrValueSpec_**,_std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>_>
                  *)in_stack_fffffffffffffba8);
      std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::erase
                ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)
                 in_stack_fffffffffffffbc0,in_stack_fffffffffffffbc8);
    }
  } while( true );
}

Assistant:

void GdlSetAttrItem::FixGlyphAttrsInRules(GrcManager * pcman,
	std::vector<GdlGlyphClassDefn *> & vpglfcInClasses, GdlRule * prule, int irit)
{
	//	method on superclass: process constraints.
	GdlRuleItem::FixGlyphAttrsInRules(pcman, vpglfcInClasses, prule, irit);

	bool fXYAt = false;			// true if the attach.at statements need to include x/y
	bool fGpointAt = false;		// true if the attach.at statements need to include gpoint
	bool fXYWith = false;		// true if the attach.with statements need to include x/y
	bool fGpointWith = false;	// true if the attach.with statements need to include gpoint
								// ...due to the way the glyph attributes are defined

	bool fAttachTo = false;		// true if an attach.to statement is present
	bool fAttachAtX = false;	// true if an attach.at.x/gpoint statement is present
	bool fAttachAtY = false;	// true if an attach.at.y/gpoint statement is present
	bool fAttachWithX = false;	// true if an attach.with.x/gpoint statement is present
	bool fAttachWithY = false;	// true if an attach.with.y/gpoint statement is present

	bool fDidAttachAt = false;	// did checks for flattened attach.at
	bool fDidAttachWith = false; // did checks for flattened attach.with

	Symbol psymOutput = OutputClassSymbol();

	//	Process attribute-setting statements.
	int ipavs;
	for (ipavs = 0; ipavs < signed(m_vpavs.size()); ipavs++)
	{
		GdlAttrValueSpec * pavs = m_vpavs[ipavs];

		//	Check that appropriate glyph attributes exist for the slot attributes that
		//	are making use of them.
		Symbol psym = pavs->m_psymName;
		Assert(psym->FitsSymbolType(ksymtSlotAttr) || psym->FitsSymbolType(ksymtFeature));

		if (psym->IsAttachAtField())
		{
			std::string staT = psym->LastField();
			fAttachAtX = fAttachAtX || staT == "x" || staT == "gpoint" || staT == "gpath";
			fAttachAtY = fAttachAtY || staT == "y" || staT == "gpoint" || staT == "gpath";

			if (staT == "gpath")
			{
				g_errorList.AddError(4127, this,
					"Cannot use gpath function within a rule");
				continue;
			}

			//	The engine currently can't handle single-point paths, and within the rule, we
			//	don't have a meaningful and consistent way to change such gpoint statements to
			//	x/y coordinates. So disallow gpoint statements in rules. If we find a way
			//	to make the engine handle single-point paths, take this code out.
			if (staT == "gpoint")
			{
				int nTmp;
				if (pavs->m_pexpValue->ResolveToInteger(&nTmp, false)) // constant, not glyph attr
				{
					g_errorList.AddError(4128, this,
						"Cannot use gpoint function within a rule");
					continue;
				}
			}

			if (fDidAttachAt && pavs->Flattened())
				//	The precompiler flattened the attach.at command into separate fields;
				//	in that case we don't need to check them twice.
				continue;

			//	The value of attach.at must be defined for the class of the slot
			//	receiving the attachment, not this slot.
			int srAttachToValue = AttachToSettingValue();	// 1-based
			if (srAttachToValue == -1)
				g_errorList.AddWarning(4514, this,
					"Attachment checks could not be done for value of attach.at");
			else if (srAttachToValue == -2)
			{
				fAttachTo = true;
				Assert(false);	// a VERY strange thing to happen.
				g_errorList.AddError(4129, this,
					"Inappropriate value of attach.to");
			}
			else
			{
				fAttachTo = true;
				if (pavs->Flattened())
				{
					pavs->CheckAttachAtPoint(pcman, vpglfcInClasses, srAttachToValue-1,
						&fXYAt, &fGpointAt);
					fDidAttachAt = true;
				}
				else
					pavs->FixGlyphAttrsInRules(pcman, vpglfcInClasses, srAttachToValue-1,
						psymOutput);
			}
		}

		else if (psym->IsAttachWithField())
		{
			std::string staT = psym->LastField();
			fAttachWithX = fAttachWithX || staT == "x" || staT == "gpoint" || staT == "gpath";
			fAttachWithY = fAttachWithY || staT == "y" || staT == "gpoint" || staT == "gpath";

			if (staT == "gpath")
			{
				g_errorList.AddError(4130, this,
					"Cannot use gpath function within a rule");
				continue;
			}

			if (fDidAttachWith && pavs->Flattened())
				//	The precompiler flattened the attach.with command into separate fields;
				//	in that case we don't need to check them twice.
				continue;

			if (!fAttachTo)
				fAttachTo = (AttachToSettingValue() != -1);

			if (pavs->Flattened())
			{
				pavs->CheckAttachWithPoint(pcman, vpglfcInClasses, irit,
					&fXYWith, &fGpointWith);
				fDidAttachWith = true;
			}
			else
				pavs->FixGlyphAttrsInRules(pcman, vpglfcInClasses, irit, psymOutput);
		}

		else if (psym->IsComponentRef())
		{
			CheckCompBox(pcman, psym);
		}

		else if (psymOutput == NULL)
		{	// error condition
		}
		else
		{
			if (psym->IsAttachTo())
			{
				GdlSlotRefExpression * pexpSR =
					dynamic_cast<GdlSlotRefExpression *>(pavs->m_pexpValue);
				if (pexpSR)
				{
					auto srAttachTo = static_cast<unsigned int>(pexpSR->SlotNumber());
					if (srAttachTo == 0)
					{
						// no attachment
					}
					else if (prule->NumberOfSlots() <= srAttachTo - 1)
					{
						//	slot out of range--error will be produced later
					}
					// Go ahead and allow this:
//					else if (!dynamic_cast<GdlSetAttrItem *>(prule->Item(srAttachTo - 1)))
//						g_errorList.AddError(4131, this,
//							"Cannot attach to an item in the context");
				}
			}
			pavs->FixGlyphAttrsInRules(pcman, vpglfcInClasses, irit, psymOutput);
		}
	}

	if ((fAttachTo || fAttachAtX || fAttachAtY || fAttachWithX || fAttachWithY) &&
		(!fAttachTo || !fAttachAtX || !fAttachAtY || !fAttachWithX || !fAttachWithY))
	{
		if ((fAttachAtX || fAttachAtY) && !fAttachTo)
			g_errorList.AddError(4132, this,
				"Cannot specify attach.at without attach.to");
		else
			g_errorList.AddWarning(4515, this,
				"Incomplete attachment specification");
	}

	//	Delete any superfluous attach commands (that were added in FlattenPointSlotAttrs
	//	but not needed); ie, either the x/y point fields or the gpath field. It's possible
	//	that we need to keep both versions, if one set of glyphs uses one and another set
	//	uses the other.
	for (ipavs = signed(m_vpavs.size()); --ipavs >= 0; )
	{
		bool fDeleteThis = false;
		Symbol psym = m_vpavs[ipavs]->m_psymName;
		if (psym->IsAttachAtField() && m_vpavs[ipavs]->Flattened())
		{
			if (!fXYAt && (psym->LastFieldIs("x") || psym->LastFieldIs("y")))
				//	Keep attach.at.gpoint; throw away x/y.
				fDeleteThis = true;
			else if (!fGpointAt && psym->LastFieldIs("gpoint"))
				//	Keep attach.at.x/y; throw away gpoint.
				fDeleteThis = true;
		}
		else if (psym->IsAttachWithField() && m_vpavs[ipavs]->Flattened())
		{
			if (!fXYWith && (psym->LastFieldIs("x") || psym->LastFieldIs("y")))
				//	Keep attach.with.gpoint; throw away x/y.
				fDeleteThis = true;
			else if (!fGpointWith && psym->LastFieldIs("gpoint"))
				//	Keep attach.with.x/y; throw away gpoint;
				fDeleteThis = true;
		}

		if (fDeleteThis)
		{
			delete m_vpavs[ipavs];
			m_vpavs.erase(m_vpavs.begin() + ipavs);
		}
	}
}